

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
                 *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_1,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2,int dist)

{
  _func_int **pp_Var1;
  pointer puVar2;
  pointer pmVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  uint uVar11;
  pointer puVar12;
  ostream *poVar13;
  pointer pmVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  pointer puVar20;
  ulong uVar21;
  pointer pTVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  bool bVar28;
  size_t prefix;
  int overlap_type;
  vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_> msgs;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> bucket;
  int my_schedule;
  comm *local_188;
  custom_op<unsigned_long,_true> op;
  int left_p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> active_elements;
  ulong local_120;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> left_bucket;
  vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_> out_of_bounds_msgs;
  size_t local_e0;
  size_t unresolved_els;
  int result_2;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> right_bucket;
  size_t rebucket_offset;
  size_t bucket_offset;
  size_t unfinished_b;
  unsigned_long result;
  long local_68;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> border_bucket;
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
  minqueries;
  
  local_120 = (ulong)(uint)dist;
  local_188 = &this->comm;
  uVar11 = mxx::left_shift<unsigned_int>
                     ((param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start,local_188);
  prefix = (size_t)(this->part).prefix;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar12 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar12) {
    uVar27 = 0;
    do {
      uVar18 = uVar27 + prefix + 1;
      if (((uVar18 != puVar12[uVar27]) ||
          ((uVar21 = this->local_size - 1, uVar27 < uVar21 && (uVar18 == puVar12[uVar27 + 1])))) ||
         ((uVar27 == uVar21 &&
          ((prefix + uVar27 + (1 - (ulong)uVar11) == 0 && ((this->comm).m_rank < this->p + -1))))))
      {
        op._vptr_custom_op = (_func_int **)CONCAT44(op._vptr_custom_op._4_4_,(uint)uVar27);
        if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&active_elements,
                     (iterator)
                     active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(uint *)&op);
        }
        else {
          *active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)uVar27;
          active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar27 = uVar27 + 1;
      puVar12 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar27 < (ulong)((long)(param_1->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 2)
            );
  }
  pp_Var1 = (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
  op._vptr_custom_op = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&op,"get active elements","");
  if (op._vptr_custom_op != pp_Var1) {
    operator_delete(op._vptr_custom_op);
  }
  if ((this->comm).m_rank < this->p + -1) {
    bVar28 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1] == uVar11;
  }
  else {
    bVar28 = false;
  }
  if ((ulong)(uint)dist < this->n) {
    do {
      puVar12 = active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      unresolved_els = 0;
      unfinished_b = 0;
      for (puVar20 = active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start; iVar17 = (int)local_120,
          puVar20 != puVar12; puVar20 = puVar20 + 1) {
        uVar27 = (ulong)*puVar20;
        lVar25 = prefix + uVar27;
        puVar2 = (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(puVar2[uVar27] + iVar17) < this->n) {
          op._vptr_custom_op = (_func_int **)CONCAT44((int)lVar25,puVar2[uVar27] + iVar17);
          if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
            _M_realloc_insert<mypair<unsigned_int>>
                      ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)&msgs,
                       (iterator)
                       msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_int> *)&op);
          }
          else {
            *msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish = (mypair<unsigned_int>)op._vptr_custom_op;
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 msgs.
                 super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          op._vptr_custom_op = (_func_int **)(lVar25 << 0x20);
          if (out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
            _M_realloc_insert<mypair<unsigned_int>>
                      ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)
                       &out_of_bounds_msgs,
                       (iterator)
                       out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_int> *)&op);
          }
          else {
            *out_of_bounds_msgs.
             super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish = (mypair<unsigned_int>)op._vptr_custom_op;
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 out_of_bounds_msgs.
                 super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        unresolved_els = unresolved_els + 1;
        if (lVar25 + 1U ==
            (ulong)(param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar27]) {
          unfinished_b = unfinished_b + 1;
        }
      }
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unresolved_els,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      lVar25 = CONCAT44(result._4_4_,(uint)result);
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unfinished_b,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      if ((this->comm).m_rank == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," unresolved = ",0xe);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," unfinished = ",0xe);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      if (lVar25 != 0) {
        mxx::
        all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_1_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,local_188);
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar12 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar14 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pmVar14->first = puVar12[pmVar14->first - prefix];
            pmVar14 = pmVar14 + 1;
          } while (pmVar14 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        mxx::
        all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_2_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,local_188);
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
          std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>>
                    ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)&msgs,
                     msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        pmVar3 = msgs.
                 super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pmVar14 = msgs.
                  super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               out_of_bounds_msgs.
               super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar27 = (long)msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)msgs.
                       super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (uVar27 != unresolved_els) {
          __assert_fail("msgs.size() == unresolved_els",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5be,
                        "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                       );
        }
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar16 = 0x3f;
          if (uVar27 != 0) {
            for (; uVar27 >> lVar16 == 0; lVar16 = lVar16 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&,mypair<unsigned_int>const&)_1_>>
                    (msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&,mypair<unsigned_int>const&)_1_>>
                    (pmVar14,pmVar3);
        }
        bucket.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        bucket.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bucket.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        left_bucket.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        left_bucket.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        left_bucket.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        right_bucket.
        super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        right_bucket.
        super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        right_bucket.
        super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        overlap_type = 0;
        uVar24 = *(param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        local_e0 = 0;
        local_68 = lVar25;
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_e0 = 0;
          pmVar14 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            uVar15 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[pmVar14->second - prefix];
            uVar27 = (ulong)(uVar15 - 1);
            if (uVar15 - 1 != pmVar14->second && prefix <= uVar27) {
              __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x5dc,
                            "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                           );
            }
            if (pmVar14 !=
                msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              puVar12 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar23 = puVar12[pmVar14->second - prefix];
              pmVar3 = pmVar14;
              while (pmVar14 = pmVar3, uVar23 == uVar15) {
                pmVar14 = pmVar3 + 1;
                uVar18 = (ulong)pmVar3->second;
                if ((uVar18 < prefix) || (prefix + this->local_size <= uVar18)) {
                  __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                                ,0x5e1,
                                "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                               );
                }
                uVar23 = (this->local_SA).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar18 - prefix];
                op.m_user_func.super__Function_base._M_functor._4_4_ =
                     (undefined4)
                     (op.m_user_func.super__Function_base._M_functor._M_unused._M_member_pointer >>
                     0x20);
                op.m_user_func.super__Function_base._M_functor._0_4_ = uVar23;
                op._vptr_custom_op = (_func_int **)CONCAT44(pmVar3->first,puVar12[uVar18 - prefix]);
                if (bucket.
                    super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    bucket.
                    super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>::
                  _M_realloc_insert<TwoBSA<unsigned_int>const&>
                            ((vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>> *)
                             &bucket,(iterator)
                                     bucket.
                                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                             (TwoBSA<unsigned_int> *)&op);
                }
                else {
                  (bucket.
                   super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->SA = uVar23;
                  *(_func_int ***)
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish = op._vptr_custom_op;
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       bucket.
                       super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                if (pmVar14 ==
                    msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
                puVar12 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar23 = puVar12[pmVar3[1].second - prefix];
                pmVar3 = pmVar14;
              }
            }
            pTVar10 = right_bucket.
                      super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar9 = right_bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar8 = right_bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar7 = left_bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar6 = left_bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar5 = left_bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar4 = bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar22 = bucket.
                      super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pmVar14 ==
                 msgs.
                 super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish) && (bVar28)) {
              if ((this->p + -1 <= (this->comm).m_rank) ||
                 ((param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish[-1] != uVar11)) {
                __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x5eb,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
              if (uVar27 < prefix) {
                left_bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                left_bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                left_bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start = pTVar5;
                bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = pTVar6;
                bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar7;
                overlap_type = 4;
              }
              else {
                overlap_type = overlap_type + 2;
                right_bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                right_bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                right_bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start = pTVar8;
                bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = pTVar9;
                bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar10;
                local_e0 = uVar27 - prefix;
              }
            }
            else if (uVar27 < prefix) {
              overlap_type = overlap_type + 1;
              left_bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              left_bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              left_bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start = pTVar5;
              bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = pTVar6;
              bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar7;
            }
            else {
              if (bucket.
                  super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                uVar18 = ((long)bucket.
                                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)bucket.
                                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x5555555555555555;
                lVar25 = 0x3f;
                if (uVar18 != 0) {
                  for (; uVar18 >> lVar25 == 0; lVar25 = lVar25 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (bucket.
                           super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           bucket.
                           super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           ((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (pTVar22,pTVar4);
              }
              sVar26 = uVar27 - prefix;
              if ((sVar26 != 0) &&
                 (uVar15 <= (param_1->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[sVar26 - 1])) {
                __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x603,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
              if (bucket.
                  super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                puVar12 = (this->local_SA).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar20 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar25 = 0;
                pTVar22 = bucket.
                          super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar23 = uVar15;
                do {
                  if ((lVar25 != 0) &&
                     (*(int *)((long)bucket.
                                     super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar25 + -8) !=
                      *(int *)((long)&(bucket.
                                       super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->B2 + lVar25))) {
                    uVar23 = uVar15;
                  }
                  puVar12[sVar26] = pTVar22->SA;
                  puVar20[sVar26] = uVar23;
                  sVar26 = sVar26 + 1;
                  pTVar22 = pTVar22 + 1;
                  uVar15 = uVar15 + 1;
                  lVar25 = lVar25 + 0xc;
                } while (pTVar22 !=
                         bucket.
                         super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              if ((sVar26 != this->local_size) &&
                 (prefix + sVar26 + 1 !=
                  (ulong)(param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[sVar26])) {
                __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x620,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
            }
            if (bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                bucket.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
          } while (pmVar14 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        my_schedule = -1;
        if ((this->comm).m_rank == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&op,(long)this->p,
                     (allocator_type *)&result);
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,op._vptr_custom_op,1,&ompi_mpi_int,0,
                     (this->comm).mpi_comm);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&result,(long)this->p,
                     (allocator_type *)&border_bucket);
          if (0 < this->p) {
            lVar16 = 0;
            lVar25 = CONCAT44(result._4_4_,(uint)result);
            iVar19 = 0;
            do {
              switch(*(undefined4 *)((long)op._vptr_custom_op + lVar16 * 4)) {
              case 0:
                *(undefined4 *)(lVar25 + lVar16 * 4) = 0xffffffff;
                break;
              case 1:
              case 4:
                *(int *)(lVar25 + lVar16 * 4) = iVar19;
                break;
              case 2:
                *(undefined4 *)(lVar25 + lVar16 * 4) = 0;
                iVar19 = 0;
                break;
              case 3:
                *(int *)(lVar25 + lVar16 * 4) = iVar19;
                iVar19 = 1 - iVar19;
                break;
              default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x64d,
                              "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                             );
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < this->p);
          }
          MPI_Scatter(CONCAT44(result._4_4_,(uint)result),1,&ompi_mpi_int,&my_schedule,1,
                      &ompi_mpi_int,0,(this->comm).mpi_comm);
          if ((void *)CONCAT44(result._4_4_,(uint)result) != (void *)0x0) {
            operator_delete((void *)CONCAT44(result._4_4_,(uint)result));
          }
          if (op._vptr_custom_op != (_func_int **)0x0) {
            operator_delete(op._vptr_custom_op);
          }
        }
        else {
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
          MPI_Scatter(0,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        }
        uVar24 = uVar24 - 1;
        iVar19 = 0;
        do {
          std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::vector
                    (&border_bucket,&left_bucket);
          uVar11 = (this->part).div1mod;
          if (uVar24 < uVar11) {
            left_p = uVar24 / ((this->part).div + 1);
          }
          else {
            left_p = (uVar24 - uVar11) / (this->part).div + (this->part).mod;
          }
          bucket_offset = 0;
          rebucket_offset = (ulong)uVar24;
          if (iVar19 == my_schedule || overlap_type != 3) {
            if (overlap_type == 2 && iVar19 == my_schedule) goto LAB_00140b8b;
            bVar28 = overlap_type != 0 && iVar19 == my_schedule;
          }
          else {
LAB_00140b8b:
            std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::operator=
                      (&border_bucket,&right_bucket);
            left_p = (this->comm).m_rank;
            bucket_offset = local_e0;
            bVar28 = true;
            rebucket_offset = prefix + local_e0;
          }
          op._vptr_custom_op = (_func_int **)&left_p;
          op.m_user_func.super__Function_base._M_functor._M_unused._M_object = &border_bucket;
          op.m_user_func.super__Function_base._M_manager = (_Manager_type)&rebucket_offset;
          op.m_user_func._M_invoker = (_Invoker_type)&minqueries;
          op._40_8_ = &bucket_offset;
          op.m_op = (MPI_Op)&prefix;
          op.m_user_func.super__Function_base._M_functor._8_8_ = this;
          op.m_type_copy = (MPI_Datatype)param_1;
          result._0_4_ = (uint)bVar28;
          MPI_Allreduce((comm *)&result,&result_2,1,&ompi_mpi_int,&ompi_mpi_op_land,
                        (this->comm).mpi_comm);
          if (result_2 == 0) {
            mxx::comm::split((comm *)&result,local_188,(uint)bVar28);
            if (bVar28 != false) {
              construct_msgs::anon_class_64_8_0d7252e9::operator()
                        ((anon_class_64_8_0d7252e9 *)&op,(comm *)&result);
            }
            mxx::comm::~comm((comm *)&result);
          }
          else {
            construct_msgs::anon_class_64_8_0d7252e9::operator()
                      ((anon_class_64_8_0d7252e9 *)&op,local_188);
          }
          MPI_Barrier((this->comm).mpi_comm);
          if (border_bucket.
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(border_bucket.
                            super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 == 1);
        uVar11 = mxx::left_shift<unsigned_int>
                           ((param_1->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start,local_188);
        if ((this->comm).m_rank < this->p + -1) {
          bVar28 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish[-1] == uVar11;
        }
        else {
          bVar28 = false;
        }
        pmVar14 = msgs.
                  super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        for (; pmVar14 !=
               msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; pmVar14 = pmVar14 + 1) {
          uVar24 = pmVar14->second - (int)prefix;
          uVar27 = (ulong)uVar24;
          op._vptr_custom_op = (_func_int **)CONCAT44(op._vptr_custom_op._4_4_,uVar24);
          puVar12 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar15 = pmVar14->second + 1;
          if (((puVar12[uVar27] != uVar15) ||
              ((uVar18 = this->local_size - 1, uVar27 < uVar18 && (puVar12[uVar24 + 1] == uVar15))))
             || ((uVar18 == uVar27 && ((uVar11 == uVar15 && ((this->comm).m_rank < this->p + -1)))))
             ) {
            if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&active_elements,
                         (iterator)
                         active_elements.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(uint *)&op);
            }
            else {
              *active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = uVar24;
              active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar12 = (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar20 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar14 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            lVar25 = pmVar14->second - prefix;
            pmVar14->first = puVar12[lVar25];
            pmVar14->second = puVar20[lVar25];
            pmVar14 = pmVar14 + 1;
          } while (pmVar14 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        mxx::
        all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_3_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,local_188);
        pp_Var1 = (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
        if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar12 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar14 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            puVar12[pmVar14->first - prefix] = pmVar14->second;
            pmVar14 = pmVar14 + 1;
          } while (pmVar14 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        op._vptr_custom_op = pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&op,"bucket-chaising iteration","");
        if (op._vptr_custom_op != pp_Var1) {
          operator_delete(op._vptr_custom_op);
        }
        lVar25 = local_68;
        if (minqueries.
            super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(minqueries.
                          super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (right_bucket.
            super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(right_bucket.
                          super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (left_bucket.
            super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(left_bucket.
                          super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bucket.super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(bucket.
                          super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(out_of_bounds_msgs.
                        super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(msgs.
                        super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    } while ((lVar25 != 0) && (local_120 = (ulong)(uint)(iVar17 * 2), local_120 < this->n));
  }
  if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}